

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O0

void __thiscall
testing::
Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
Matcher(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *this,string *s)

{
  string *in_RSI;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_68 [88];
  string *local_10;
  
  local_10 = in_RSI;
  internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::MatcherBase(in_RDI);
  (in_RDI->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_00235498;
  std::__cxx11::string::string(local_68,local_10);
  Eq<std::__cxx11::string>(in_stack_ffffffffffffff78);
  Matcher<std::__cxx11::string_const&>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)in_RDI,
             (EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff78);
  operator=((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *)in_RDI,
            (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *)in_stack_ffffffffffffff78);
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)0x1b1fb3);
  internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher((EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1b1fbd);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

Matcher<const std::string&>::Matcher(const std::string& s) { *this = Eq(s); }